

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

Value * duckdb::NumericStats::MaxOrNull(Value *__return_storage_ptr__,BaseStatistics *stats)

{
  LogicalType LStack_28;
  
  if (((stats->type).id_ == SQLNULL) || (((stats->stats_union).string_data.min[1] & 1) == 0)) {
    LogicalType::LogicalType(&LStack_28,&stats->type);
    Value::Value(__return_storage_ptr__,&LStack_28);
    LogicalType::~LogicalType(&LStack_28);
  }
  else {
    Max(__return_storage_ptr__,stats);
  }
  return __return_storage_ptr__;
}

Assistant:

Value NumericStats::MaxOrNull(const BaseStatistics &stats) {
	if (!NumericStats::HasMax(stats)) {
		return Value(stats.GetType());
	}
	return NumericStats::Max(stats);
}